

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_lightdata.cpp
# Opt level: O0

void gl_SetFogParams(int _fogdensity,PalEntry _outsidefogcolor,int _outsidefogdensity,int _skyfog)

{
  int _skyfog_local;
  int _outsidefogdensity_local;
  int _fogdensity_local;
  PalEntry _outsidefogcolor_local;
  
  outsidefogcolor = _outsidefogcolor;
  skyfog = _skyfog;
  outsidefogdensity = _outsidefogdensity >> 1;
  fogdensity = _fogdensity >> 1;
  return;
}

Assistant:

void gl_SetFogParams(int _fogdensity, PalEntry _outsidefogcolor, int _outsidefogdensity, int _skyfog)
{
	fogdensity=_fogdensity;
	outsidefogcolor=_outsidefogcolor;
	outsidefogdensity=_outsidefogdensity;
	skyfog=_skyfog;

	outsidefogdensity>>=1;
	fogdensity>>=1;
}